

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.h
# Opt level: O0

void __thiscall re2::HashMix::Mix(HashMix *this,size_t val)

{
  size_t val_local;
  HashMix *this_local;
  
  this->hash_ = this->hash_ * -0x23c146b50754b36d;
  this->hash_ = (this->hash_ << 0x13 | this->hash_ >> 0x2d) + val;
  return;
}

Assistant:

void Mix(size_t val) {
    static const size_t kMul = static_cast<size_t>(0xdc3eb94af8ab4c93ULL);
    hash_ *= kMul;
    hash_ = ((hash_ << 19) |
             (hash_ >> (std::numeric_limits<size_t>::digits - 19))) + val;
  }